

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O0

void __thiscall
dg::vr::ValueRelations::RelatedValueIterator::RelatedValueIterator
          (RelatedValueIterator *this,ValueRelations *v,Handle start,Relations *allowedEdges)

{
  iterator iVar1;
  const_iterator cVar2;
  RelatedValueIterator *in_RCX;
  undefined8 in_RSI;
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  *in_RDI;
  RelatedValueIterator *unaff_retaddr;
  bool in_stack_00000057;
  Relations *in_stack_00000058;
  Bucket *in_stack_00000060;
  RelationsGraph<dg::vr::ValueRelations> *in_stack_00000068;
  
  *(undefined8 *)&(in_RDI->_M_t)._M_impl = in_RSI;
  RelationsGraph<dg::vr::ValueRelations>::getRelated
            (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000057);
  iVar1 = std::
          map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
          ::begin(in_RDI);
  *(_Base_ptr *)&in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_header = iVar1._M_node;
  getCurrentEqual(in_RCX);
  cVar2 = VectorSet<const_llvm::Value_*>::begin((VectorSet<const_llvm::Value_*> *)in_RDI);
  in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)cVar2._M_current;
  std::pair<const_llvm::Value_*,_dg::vr::Relations>::
  pair<const_llvm::Value_*,_dg::vr::Relations,_true>
            ((pair<const_llvm::Value_*,_dg::vr::Relations> *)in_RCX);
  *(undefined1 *)&in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  nextViableValue(unaff_retaddr);
  return;
}

Assistant:

RelatedValueIterator(const ValueRelations &v, Handle start,
                             const Relations &allowedEdges)
                : vr(v), related(vr.graph.getRelated(start, allowedEdges)),
                  bucketIt(related.begin()),
                  valueIt(getCurrentEqual().begin()) {
            assert(allowedEdges.has(Relations::EQ) &&
                   "at least one related bucket");
            nextViableValue();
        }